

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

void compactor_get_next_filename(char *file,char *nextfile)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int compaction_no;
  char str_no [24];
  stat st;
  int local_dc;
  char local_d8 [32];
  stat local_b8;
  
  local_dc = 0;
  sVar3 = strlen(file);
  uVar1 = (int)sVar3 + 1;
  uVar7 = sVar3 & 0xffffffff;
  do {
    uVar4 = uVar7;
    if ((int)uVar4 < 1) {
      uVar1 = 0;
      break;
    }
    uVar1 = uVar1 - 1;
    uVar7 = uVar4 - 1;
  } while (file[uVar4 - 1] != '.');
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
    __s = file + uVar7;
    sVar3 = strlen(__s);
    uVar1 = (uint)sVar3;
    bVar8 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      if ((byte)(*__s - 0x3aU) < 0xf6) goto LAB_0010f688;
      uVar5 = 0;
      if (0 < (int)uVar4) {
        uVar5 = uVar4 & 0xffffffff;
      }
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if ((uVar1 & 0x7fffffff) == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (0xf5 < (byte)(file[uVar6 + uVar5] - 0x3aU));
      bVar8 = (uVar1 & 0x7fffffff) <= uVar6;
    }
    if (bVar8) {
      __isoc99_sscanf(__s,"%d",&local_dc);
      strncpy(nextfile,file,uVar7);
      do {
        nextfile[uVar7] = '\0';
        local_dc = local_dc + 1;
        sprintf(local_d8,"%d");
        strcat(nextfile,local_d8);
        iVar2 = stat(nextfile,&local_b8);
      } while (iVar2 == 0);
      return;
    }
  }
LAB_0010f688:
  do {
    strcpy(nextfile,file);
    local_dc = local_dc + 1;
    sprintf(local_d8,".%d");
    strcat(nextfile,local_d8);
    iVar2 = stat(nextfile,&local_b8);
  } while (iVar2 == 0);
  return;
}

Assistant:

void compactor_get_next_filename(char *file, char *nextfile)
{
    int compaction_no = 0;
    int prefix_len = _compactor_prefix_len(file);
    char str_no[24];

    if (prefix_len > 0 && _allDigit(file + prefix_len)) {
        sscanf(file+prefix_len, "%d", &compaction_no);
        strncpy(nextfile, file, prefix_len);
        do {
            nextfile[prefix_len] = 0;
            sprintf(str_no, "%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    } else {
        do {
            strcpy(nextfile, file);
            sprintf(str_no, ".%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    }
}